

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_customUnitsScalingFactorSimple_Test::~Units_customUnitsScalingFactorSimple_Test
          (Units_customUnitsScalingFactorSimple_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, customUnitsScalingFactorSimple)
{
    auto m = libcellml::Model::create("model");
    auto u1 = libcellml::Units::create("u1");
    m->addUnits(u1);
    auto u2 = libcellml::Units::create("u2");
    u2->addUnit("u1");
    m->addUnits(u2);

    m->linkUnits();

    EXPECT_TRUE(libcellml::Units::compatible(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}